

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O3

bool SetGenericProperty<aiMatrix4x4t<float>>
               (map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                *list,char *szName,aiMatrix4x4t<float> *value)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  uint uVar14;
  bool bVar15;
  pair<unsigned_int,_aiMatrix4x4t<float>_> local_5c;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/GenericProperty.h"
                  ,0x39,
                  "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = aiMatrix4x4t<float>]"
                 );
  }
  sVar11 = strlen(szName);
  uVar10 = (uint)sVar11;
  uVar14 = 0;
  if (3 < uVar10) {
    uVar9 = uVar10 >> 2;
    uVar14 = 0;
    do {
      uVar14 = (*(ushort *)szName + uVar14) * 0x10000 ^
               (uint)*(ushort *)((long)szName + 2) << 0xb ^ *(ushort *)szName + uVar14;
      szName = (char *)((long)szName + 4);
      uVar14 = (uVar14 >> 0xb) + uVar14;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  switch(uVar10 & 3) {
  case 0:
    goto switchD_001384a2_caseD_0;
  case 1:
    uVar14 = uVar14 + (int)(char)*(ushort *)szName;
    uVar10 = uVar14 * 0x400 ^ uVar14;
    uVar14 = uVar10 >> 1;
    break;
  case 2:
    uVar10 = (uVar14 + *(ushort *)szName) * 0x800 ^ uVar14 + *(ushort *)szName;
    uVar14 = uVar10 >> 0x11;
    break;
  case 3:
    uVar14 = (uVar14 + *(ushort *)szName) * 0x10000 ^
             (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ uVar14 + *(ushort *)szName;
    uVar14 = (uVar14 >> 0xb) + uVar14;
    goto switchD_001384a2_caseD_0;
  }
  uVar14 = uVar14 + uVar10;
switchD_001384a2_caseD_0:
  uVar14 = uVar14 * 8 ^ uVar14;
  uVar14 = (uVar14 >> 5) + uVar14;
  uVar14 = uVar14 * 0x10 ^ uVar14;
  uVar14 = (uVar14 >> 0x11) + uVar14;
  uVar14 = uVar14 * 0x2000000 ^ uVar14;
  local_5c.first = (uVar14 >> 6) + uVar14;
  p_Var13 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var13 != (_Base_ptr)0x0) {
    p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
    p_Var12 = &p_Var1->_M_header;
    do {
      bVar15 = p_Var13[1]._M_color < local_5c.first;
      if (!bVar15) {
        p_Var12 = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[bVar15];
    } while (p_Var13 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var12 != p_Var1) && (p_Var12[1]._M_color <= local_5c.first)) {
      uVar2 = *(undefined8 *)value;
      uVar3 = *(undefined8 *)&value->a3;
      uVar4 = *(undefined8 *)&value->b1;
      uVar5 = *(undefined8 *)&value->b3;
      uVar6 = *(undefined8 *)&value->c1;
      uVar7 = *(undefined8 *)&value->c3;
      uVar8 = *(undefined8 *)&value->d3;
      *(undefined8 *)((long)&p_Var12[2]._M_left + 4) = *(undefined8 *)&value->d1;
      *(undefined8 *)((long)&p_Var12[2]._M_right + 4) = uVar8;
      *(undefined8 *)&p_Var12[2].field_0x4 = uVar6;
      *(undefined8 *)((long)&p_Var12[2]._M_parent + 4) = uVar7;
      *(undefined8 *)((long)&p_Var12[1]._M_left + 4) = uVar4;
      *(undefined8 *)((long)&p_Var12[1]._M_right + 4) = uVar5;
      *(undefined8 *)&p_Var12[1].field_0x4 = uVar2;
      *(undefined8 *)((long)&p_Var12[1]._M_parent + 4) = uVar3;
      return true;
    }
  }
  local_5c.second.a1 = value->a1;
  local_5c.second.a2 = value->a2;
  local_5c.second.a3 = value->a3;
  local_5c.second.a4 = value->a4;
  local_5c.second.b1 = value->b1;
  local_5c.second.b2 = value->b2;
  local_5c.second.b3 = value->b3;
  local_5c.second.b4 = value->b4;
  local_5c.second.c1 = value->c1;
  local_5c.second.c2 = value->c2;
  local_5c.second.c3 = value->c3;
  local_5c.second.c4 = value->c4;
  local_5c.second.d1 = value->d1;
  local_5c.second.d2 = value->d2;
  local_5c.second.d3 = value->d3;
  local_5c.second.d4 = value->d4;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMatrix4x4t<float>>,std::_Select1st<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>>
  ::_M_emplace_unique<std::pair<unsigned_int,aiMatrix4x4t<float>>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMatrix4x4t<float>>,std::_Select1st<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>>
              *)list,&local_5c);
  return false;
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}